

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O2

bool __thiscall libwebm::VpxPesParser::ParsePesHeader(VpxPesParser *this,PesHeader *header)

{
  VpxPesParser VVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  uint8_t (*__range1) [4];
  
  if (header == (PesHeader *)0x0) {
    return false;
  }
  if ((*(int *)(this + 0x78) == 1) && (bVar3 = VerifyPacketStartCode(this), bVar3)) {
    lVar2 = *(long *)(this + 0x70);
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      header->start_code[lVar4] = *(uint8_t *)(lVar4 + *(long *)(this + 0x58) + lVar2);
    }
    bVar3 = ReadStreamId(this,&header->stream_id);
    if (bVar3) {
      VVar1 = (VpxPesParser)header->stream_id;
      if ((byte)VVar1 < (byte)*this) {
        return false;
      }
      if ((byte)this[1] < (byte)VVar1) {
        return false;
      }
      bVar3 = ReadPacketLength(this,&header->packet_length);
      if (bVar3) {
        *(long *)(this + 0x70) = *(long *)(this + 0x70) + *(long *)(this + 8);
        *(undefined4 *)(this + 0x78) = 2;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool VpxPesParser::ParsePesHeader(PesHeader* header) {
  if (!header || parse_state_ != kParsePesHeader)
    return false;

  if (!VerifyPacketStartCode())
    return false;

  std::size_t pos = read_pos_;
  for (auto& a : header->start_code) {
    a = pes_file_data_[pos++];
  }

  // PES Video stream IDs start at E0.
  if (!ReadStreamId(&header->stream_id))
    return false;

  if (header->stream_id < kMinVideoStreamId ||
      header->stream_id > kMaxVideoStreamId)
    return false;

  if (!ReadPacketLength(&header->packet_length))
    return false;

  read_pos_ += kPesHeaderSize;
  parse_state_ = kParsePesOptionalHeader;
  return true;
}